

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_acbp_v2.cpp
# Opt level: O0

void __thiscall
intel_acbp_v2_t::acbp_element_t::acbp_element_t
          (acbp_element_t *this,kstream *p__io,intel_acbp_v2_t *p__parent,intel_acbp_v2_t *p__root)

{
  intel_acbp_v2_t *p__root_local;
  intel_acbp_v2_t *p__parent_local;
  kstream *p__io_local;
  acbp_element_t *this_local;
  
  kaitai::kstruct::kstruct(&this->super_kstruct,p__io);
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__acbp_element_t_002705e0;
  std::unique_ptr<intel_acbp_v2_t::header_t,std::default_delete<intel_acbp_v2_t::header_t>>::
  unique_ptr<std::default_delete<intel_acbp_v2_t::header_t>,void>
            ((unique_ptr<intel_acbp_v2_t::header_t,std::default_delete<intel_acbp_v2_t::header_t>> *
             )&this->m_header);
  std::unique_ptr<intel_acbp_v2_t::ibbs_body_t,std::default_delete<intel_acbp_v2_t::ibbs_body_t>>::
  unique_ptr<std::default_delete<intel_acbp_v2_t::ibbs_body_t>,void>
            ((unique_ptr<intel_acbp_v2_t::ibbs_body_t,std::default_delete<intel_acbp_v2_t::ibbs_body_t>>
              *)&this->m_ibbs_body);
  std::unique_ptr<intel_acbp_v2_t::pmda_body_t,std::default_delete<intel_acbp_v2_t::pmda_body_t>>::
  unique_ptr<std::default_delete<intel_acbp_v2_t::pmda_body_t>,void>
            ((unique_ptr<intel_acbp_v2_t::pmda_body_t,std::default_delete<intel_acbp_v2_t::pmda_body_t>>
              *)&this->m_pmda_body);
  std::__cxx11::string::string((string *)&this->m_generic_body);
  this->m__parent = p__parent;
  this->m__root = p__root;
  std::unique_ptr<intel_acbp_v2_t::header_t,_std::default_delete<intel_acbp_v2_t::header_t>_>::
  operator=(&this->m_header,(nullptr_t)0x0);
  std::unique_ptr<intel_acbp_v2_t::ibbs_body_t,_std::default_delete<intel_acbp_v2_t::ibbs_body_t>_>
  ::operator=(&this->m_ibbs_body,(nullptr_t)0x0);
  std::unique_ptr<intel_acbp_v2_t::pmda_body_t,_std::default_delete<intel_acbp_v2_t::pmda_body_t>_>
  ::operator=(&this->m_pmda_body,(nullptr_t)0x0);
  _read(this);
  return;
}

Assistant:

intel_acbp_v2_t::acbp_element_t::acbp_element_t(kaitai::kstream* p__io, intel_acbp_v2_t* p__parent, intel_acbp_v2_t* p__root) : kaitai::kstruct(p__io) {
    m__parent = p__parent;
    m__root = p__root;
    m_header = nullptr;
    m_ibbs_body = nullptr;
    m_pmda_body = nullptr;
    _read();
}